

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

Totals * __thiscall Catch::Totals::operator-(Totals *this,Totals *other)

{
  Totals *in_RDI;
  Totals *diff;
  Totals *other_00;
  Counts *in_stack_ffffffffffffffc0;
  size_t local_38;
  size_t local_30;
  size_t local_28;
  size_t local_20;
  size_t local_18;
  
  other_00 = in_RDI;
  Totals(in_RDI);
  Counts::operator-(in_stack_ffffffffffffffc0,(Counts *)other_00);
  (in_RDI->assertions).passed = local_28;
  (in_RDI->assertions).failed = local_20;
  (in_RDI->assertions).failedButOk = local_18;
  Counts::operator-(in_stack_ffffffffffffffc0,(Counts *)other_00);
  (in_RDI->testCases).passed = (size_t)in_stack_ffffffffffffffc0;
  (in_RDI->testCases).failed = local_38;
  (in_RDI->testCases).failedButOk = local_30;
  return other_00;
}

Assistant:

Totals Totals::operator - ( Totals const& other ) const {
        Totals diff;
        diff.assertions = assertions - other.assertions;
        diff.testCases = testCases - other.testCases;
        return diff;
    }